

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

Value * system_function_len(Value *context_value,TupleValue *parameter_values)

{
  ValueType VVar1;
  Value *pVVar2;
  
  if (parameter_values->length != 0) {
    VVar1 = (*parameter_values->items)->value_type;
    if (((VVar1 == ValueTypeListValue) || (VVar1 == ValueTypeTupleValue)) ||
       (VVar1 == ValueTypeStringValue)) {
      pVVar2 = new_integer_value((*parameter_values->items)[1].linked_variable_count);
      return pVVar2;
    }
  }
  pVVar2 = new_null_value();
  return pVVar2;
}

Assistant:

Value *system_function_len(Value *context_value, TupleValue *parameter_values) {
  if (parameter_values->length == 0) return new_null_value();

  Value *value = parameter_values->items[0];

  if (value->value_type == ValueTypeStringValue) {
    StringValue *string_value = (StringValue *) value;

    return new_integer_value(string_value->length);
  }
  else if (value->value_type == ValueTypeTupleValue) {
    TupleValue *tuple_value = (TupleValue *) value;

    return new_integer_value(tuple_value->length);
  }
  else if (value->value_type == ValueTypeListValue) {
    ListValue *list_value = (ListValue *) value;

    return new_integer_value(list_value->length);
  }

  return new_null_value();
}